

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_command_buffer_push(nk_command_buffer *b,nk_command_type t,nk_size size)

{
  long in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  nk_size unaff_retaddr;
  void *memory;
  void *unaligned;
  nk_size alignment;
  nk_command *cmd;
  undefined4 *local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = (undefined4 *)0x0;
  }
  else {
    local_8 = (undefined4 *)
              nk_buffer_alloc((nk_buffer *)alignment,unaligned._4_4_,(nk_size)memory,unaff_retaddr);
    if (local_8 == (undefined4 *)0x0) {
      local_8 = (undefined4 *)0x0;
    }
    else {
      in_RDI[7] = (long)local_8 - *(long *)(*in_RDI + 0x40);
      *local_8 = in_ESI;
      *(ulong *)(local_8 + 2) =
           *(long *)(*in_RDI + 0x58) +
           (((long)local_8 + in_RDX + 7U & 0xfffffffffffffff8) - ((long)local_8 + in_RDX));
      in_RDI[6] = *(long *)(local_8 + 2);
    }
  }
  return local_8;
}

Assistant:

NK_INTERN void*
nk_command_buffer_push(struct nk_command_buffer* b,
    enum nk_command_type t, nk_size size)
{
    NK_STORAGE const nk_size align = NK_ALIGNOF(struct nk_command);
    struct nk_command *cmd;
    nk_size alignment;
    void *unaligned;
    void *memory;

    NK_ASSERT(b);
    NK_ASSERT(b->base);
    if (!b) return 0;

    cmd = (struct nk_command*)nk_buffer_alloc(b->base,NK_BUFFER_FRONT,size,align);
    if (!cmd) return 0;

    /* make sure the offset to the next command is aligned */
    b->last = (nk_size)((nk_byte*)cmd - (nk_byte*)b->base->memory.ptr);
    unaligned = (nk_byte*)cmd + size;
    memory = NK_ALIGN_PTR(unaligned, align);
    alignment = (nk_size)((nk_byte*)memory - (nk_byte*)unaligned);

#ifdef NK_ZERO_COMMAND_MEMORY
    NK_MEMSET(cmd, 0, size + alignment);
#endif

    cmd->type = t;
    cmd->next = b->base->allocated + alignment;
#ifdef NK_INCLUDE_COMMAND_USERDATA
    cmd->userdata = b->userdata;
#endif
    b->end = cmd->next;
    return cmd;
}